

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

void xmlRelaxNGFreeDefine(xmlRelaxNGDefinePtr_conflict define)

{
  void *pvVar1;
  
  if (define != (xmlRelaxNGDefinePtr_conflict)0x0) {
    if ((((define->type == XML_RELAXNG_VALUE) && (define->attrs != (xmlRelaxNGDefinePtr)0x0)) &&
        (pvVar1 = define->data, pvVar1 != (void *)0x0)) &&
       (*(code **)((long)pvVar1 + 0x30) != (code *)0x0)) {
      (**(code **)((long)pvVar1 + 0x30))(*(undefined8 *)((long)pvVar1 + 8));
    }
    if (((xmlRelaxNGPartitionPtr)define->data != (xmlRelaxNGPartitionPtr)0x0) &&
       (define->type == XML_RELAXNG_INTERLEAVE)) {
      xmlRelaxNGFreePartition((xmlRelaxNGPartitionPtr)define->data);
    }
    if (((xmlHashTablePtr)define->data != (xmlHashTablePtr)0x0) &&
       (define->type == XML_RELAXNG_CHOICE)) {
      xmlHashFree((xmlHashTablePtr)define->data,(xmlHashDeallocator)0x0);
    }
    if (define->name != (xmlChar *)0x0) {
      (*xmlFree)(define->name);
    }
    if (define->ns != (xmlChar *)0x0) {
      (*xmlFree)(define->ns);
    }
    if (define->value != (xmlChar *)0x0) {
      (*xmlFree)(define->value);
    }
    if (define->contModel != (xmlRegexpPtr)0x0) {
      xmlRegFreeRegexp(define->contModel);
    }
    (*xmlFree)(define);
    return;
  }
  return;
}

Assistant:

static void
xmlRelaxNGFreeDefine(xmlRelaxNGDefinePtr define)
{
    if (define == NULL)
        return;

    if ((define->type == XML_RELAXNG_VALUE) && (define->attrs != NULL)) {
        xmlRelaxNGTypeLibraryPtr lib;

        lib = (xmlRelaxNGTypeLibraryPtr) define->data;
        if ((lib != NULL) && (lib->freef != NULL))
            lib->freef(lib->data, (void *) define->attrs);
    }
    if ((define->data != NULL) && (define->type == XML_RELAXNG_INTERLEAVE))
        xmlRelaxNGFreePartition((xmlRelaxNGPartitionPtr) define->data);
    if ((define->data != NULL) && (define->type == XML_RELAXNG_CHOICE))
        xmlHashFree((xmlHashTablePtr) define->data, NULL);
    if (define->name != NULL)
        xmlFree(define->name);
    if (define->ns != NULL)
        xmlFree(define->ns);
    if (define->value != NULL)
        xmlFree(define->value);
    if (define->contModel != NULL)
        xmlRegFreeRegexp(define->contModel);
    xmlFree(define);
}